

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodic_timer.c
# Opt level: O2

int main(void)

{
  cio_error cVar1;
  __sighandler_t p_Var2;
  int iVar3;
  cio_timer timer;
  
  p_Var2 = signal(0xf,sighandler);
  iVar3 = -1;
  if (p_Var2 != (__sighandler_t)0xffffffffffffffff) {
    p_Var2 = signal(2,sighandler);
    if (p_Var2 == (__sighandler_t)0xffffffffffffffff) {
      signal(0xf,(__sighandler_t)0x0);
    }
    else {
      cVar1 = cio_eventloop_init(&loop);
      if (cVar1 == CIO_SUCCESS) {
        cVar1 = cio_timer_init(&timer,&loop,(cio_timer_close_hook_t)0x0);
        iVar3 = 1;
        if (cVar1 == CIO_SUCCESS) {
          cVar1 = cio_timer_expires_from_now(&timer,5000000000,handle_timeout,(void *)0x0);
          if (cVar1 == CIO_SUCCESS) {
            cVar1 = cio_eventloop_run(&loop);
            if (cVar1 != CIO_SUCCESS) {
              fwrite("error in cio_eventloop_run!\n",0x1c,1,_stderr);
            }
            iVar3 = 0;
          }
          else {
            fwrite("arming timer failed!\n",0x15,1,_stderr);
          }
        }
        cio_eventloop_destroy(&loop);
      }
      else {
        iVar3 = 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
	int ret = EXIT_SUCCESS;

	if (signal(SIGTERM, sighandler) == SIG_ERR) {
		return -1;
	}

	if (signal(SIGINT, sighandler) == SIG_ERR) {
		(void)signal(SIGTERM, SIG_DFL);
		return -1;
	}

	enum cio_error err = cio_eventloop_init(&loop);
	if (err != CIO_SUCCESS) {
		return EXIT_FAILURE;
	}

	struct cio_timer timer;
	err = cio_timer_init(&timer, &loop, NULL);
	if (err != CIO_SUCCESS) {
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	if (cio_timer_expires_from_now(&timer, FIVE_S, handle_timeout, NULL) != CIO_SUCCESS) {
		(void)fprintf(stderr, "arming timer failed!\n");
		ret = EXIT_FAILURE;
		goto destroy_loop;
	}

	err = cio_eventloop_run(&loop);
	if (err != CIO_SUCCESS) {
		(void)fprintf(stderr, "error in cio_eventloop_run!\n");
	}

destroy_loop:
	cio_eventloop_destroy(&loop);

	return ret;
}